

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsException.c
# Opt level: O0

void JsBuildDefender(void *jmp_buf_p)

{
  JsList pvVar1;
  undefined8 *local_18;
  JsException *p;
  void *jmp_buf_p_local;
  
  JsAssert((uint)(jmp_buf_p != (void *)0x0));
  local_18 = (undefined8 *)JsGetTlsValue(eKey);
  if (local_18 == (undefined8 *)0x0) {
    local_18 = (undefined8 *)JsMalloc(0x18);
    pvVar1 = JsCreateList();
    *local_18 = pvVar1;
    pvVar1 = JsCreateList();
    local_18[1] = pvVar1;
    local_18[2] = 0;
    JsSetTlsValue(eKey,local_18);
  }
  JsListPush((void *)*local_18,jmp_buf_p);
  return;
}

Assistant:

void JsBuildDefender(void* jmp_buf_p){
	JsAssert(jmp_buf_p != NULL);
	struct JsException* p  = (struct JsException*)JsGetTlsValue(eKey);
	if( p == NULL){
		//TLS中没有对应的Exception对象
		p = (struct JsException* )JsMalloc(sizeof(struct JsException));
		p->defenders = JsCreateList();
		p->stack = JsCreateList();
		p->err = NULL;
		JsSetTlsValue(eKey,p);
	}
	//压入该还原点
	JsListPush(p->defenders,jmp_buf_p);
}